

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portability_path.c
# Opt level: O3

size_t portability_path_get_extension
                 (char *path,size_t path_size,char *extension,size_t extension_size)

{
  size_t sVar1;
  size_t sVar2;
  ulong uVar3;
  char cVar4;
  
  if (extension == (char *)0x0 || path == (char *)0x0) {
    return 0;
  }
  cVar4 = *path;
  if (path_size == 0 || cVar4 == '\0') {
    sVar1 = 0;
  }
  else {
    uVar3 = 1;
    sVar1 = 0;
    do {
      extension[sVar1] = cVar4;
      sVar2 = sVar1 + 1;
      if (sVar1 + 1 == extension_size) {
        sVar2 = 0;
      }
      sVar1 = sVar2;
      if ((path[uVar3 - 1] & 0xfeU) == 0x2e) {
        sVar1 = 0;
      }
      if (path_size <= uVar3) break;
      cVar4 = path[uVar3];
      uVar3 = uVar3 + 1;
    } while (cVar4 != '\0');
  }
  extension[sVar1] = '\0';
  return sVar1 + 1;
}

Assistant:

size_t portability_path_get_extension(const char *path, size_t path_size, char *extension, size_t extension_size)
{
	if (path == NULL || extension == NULL)
	{
		return 0;
	}

	size_t i, count;

	for (i = 0, count = 0; path[i] != '\0' && i < path_size; ++i)
	{
		extension[count++] = path[i];

		if (PORTABILITY_PATH_SEPARATOR(path[i]) || path[i] == '.' || count == extension_size)
		{
			count = 0;
		}
	}

	extension[count] = '\0';

	return count + 1;
}